

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

cached_power
nlohmann::json_abi_v3_11_2::detail::dtoa_impl::get_cached_power_for_binary_exponent(int e)

{
  undefined8 uVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  short sVar5;
  int iVar6;
  cached_power cVar7;
  
  if (e < -0x5dc) {
    __assert_fail("e >= -1500",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                  ,0x438d,
                  "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
                 );
  }
  if (0x5dc < e) {
    __assert_fail("e <= 1500",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                  ,0x438e,
                  "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
                 );
  }
  iVar6 = (e + 0x3d) * -0x13441;
  iVar3 = iVar6 + 0x3ffff;
  if (-1 < iVar6) {
    iVar3 = iVar6;
  }
  iVar3 = (uint)(e < -0x3d) + (iVar3 >> 0x12);
  if (iVar3 < -0x13a) {
    __assert_fail("index >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                  ,0x4393,
                  "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
                 );
  }
  sVar2 = (short)iVar3;
  sVar5 = sVar2 + 0x133;
  sVar2 = sVar2 + 0x13a;
  if (-1 < sVar5) {
    sVar2 = sVar5;
  }
  if ((ushort)((uint)(int)sVar2 >> 3) < 0x4f) {
    uVar4 = (ulong)(((uint)(int)sVar2 >> 3 & 0xffff) << 4);
    uVar1 = *(undefined8 *)
             ((long)&get_cached_power_for_binary_exponent::kCachedPowers._M_elems[0].e + uVar4);
    iVar3 = e + (int)uVar1;
    if (iVar3 < -0x7c) {
      __assert_fail("kAlpha <= cached.e + e + 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                    ,0x4397,
                    "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
                   );
    }
    if (iVar3 < -0x5f) {
      cVar7.e = (int)uVar1;
      cVar7.k = (int)((ulong)uVar1 >> 0x20);
      cVar7.f = *(uint64_t *)
                 ((long)&get_cached_power_for_binary_exponent::kCachedPowers._M_elems[0].f + uVar4);
      return cVar7;
    }
    __assert_fail("kGamma >= cached.e + e + 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                  ,0x4398,
                  "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
                 );
  }
  __assert_fail("static_cast<std::size_t>(index) < kCachedPowers.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/json/single_include/nlohmann/json.hpp"
                ,0x4394,
                "cached_power nlohmann::detail::dtoa_impl::get_cached_power_for_binary_exponent(int)"
               );
}

Assistant:

inline cached_power get_cached_power_for_binary_exponent(int e)
{
    // Now
    //
    //      alpha <= e_c + e + q <= gamma                                    (1)
    //      ==> f_c * 2^alpha <= c * 2^e * 2^q
    //
    // and since the c's are normalized, 2^(q-1) <= f_c,
    //
    //      ==> 2^(q - 1 + alpha) <= c * 2^(e + q)
    //      ==> 2^(alpha - e - 1) <= c
    //
    // If c were an exact power of ten, i.e. c = 10^k, one may determine k as
    //
    //      k = ceil( log_10( 2^(alpha - e - 1) ) )
    //        = ceil( (alpha - e - 1) * log_10(2) )
    //
    // From the paper:
    // "In theory the result of the procedure could be wrong since c is rounded,
    //  and the computation itself is approximated [...]. In practice, however,
    //  this simple function is sufficient."
    //
    // For IEEE double precision floating-point numbers converted into
    // normalized diyfp's w = f * 2^e, with q = 64,
    //
    //      e >= -1022      (min IEEE exponent)
    //           -52        (p - 1)
    //           -52        (p - 1, possibly normalize denormal IEEE numbers)
    //           -11        (normalize the diyfp)
    //         = -1137
    //
    // and
    //
    //      e <= +1023      (max IEEE exponent)
    //           -52        (p - 1)
    //           -11        (normalize the diyfp)
    //         = 960
    //
    // This binary exponent range [-1137,960] results in a decimal exponent
    // range [-307,324]. One does not need to store a cached power for each
    // k in this range. For each such k it suffices to find a cached power
    // such that the exponent of the product lies in [alpha,gamma].
    // This implies that the difference of the decimal exponents of adjacent
    // table entries must be less than or equal to
    //
    //      floor( (gamma - alpha) * log_10(2) ) = 8.
    //
    // (A smaller distance gamma-alpha would require a larger table.)

    // NB:
    // Actually this function returns c, such that -60 <= e_c + e + 64 <= -34.

    constexpr int kCachedPowersMinDecExp = -300;
    constexpr int kCachedPowersDecStep = 8;

    static constexpr std::array<cached_power, 79> kCachedPowers =
    {
        {
            { 0xAB70FE17C79AC6CA, -1060, -300 },
            { 0xFF77B1FCBEBCDC4F, -1034, -292 },
            { 0xBE5691EF416BD60C, -1007, -284 },
            { 0x8DD01FAD907FFC3C,  -980, -276 },
            { 0xD3515C2831559A83,  -954, -268 },
            { 0x9D71AC8FADA6C9B5,  -927, -260 },
            { 0xEA9C227723EE8BCB,  -901, -252 },
            { 0xAECC49914078536D,  -874, -244 },
            { 0x823C12795DB6CE57,  -847, -236 },
            { 0xC21094364DFB5637,  -821, -228 },
            { 0x9096EA6F3848984F,  -794, -220 },
            { 0xD77485CB25823AC7,  -768, -212 },
            { 0xA086CFCD97BF97F4,  -741, -204 },
            { 0xEF340A98172AACE5,  -715, -196 },
            { 0xB23867FB2A35B28E,  -688, -188 },
            { 0x84C8D4DFD2C63F3B,  -661, -180 },
            { 0xC5DD44271AD3CDBA,  -635, -172 },
            { 0x936B9FCEBB25C996,  -608, -164 },
            { 0xDBAC6C247D62A584,  -582, -156 },
            { 0xA3AB66580D5FDAF6,  -555, -148 },
            { 0xF3E2F893DEC3F126,  -529, -140 },
            { 0xB5B5ADA8AAFF80B8,  -502, -132 },
            { 0x87625F056C7C4A8B,  -475, -124 },
            { 0xC9BCFF6034C13053,  -449, -116 },
            { 0x964E858C91BA2655,  -422, -108 },
            { 0xDFF9772470297EBD,  -396, -100 },
            { 0xA6DFBD9FB8E5B88F,  -369,  -92 },
            { 0xF8A95FCF88747D94,  -343,  -84 },
            { 0xB94470938FA89BCF,  -316,  -76 },
            { 0x8A08F0F8BF0F156B,  -289,  -68 },
            { 0xCDB02555653131B6,  -263,  -60 },
            { 0x993FE2C6D07B7FAC,  -236,  -52 },
            { 0xE45C10C42A2B3B06,  -210,  -44 },
            { 0xAA242499697392D3,  -183,  -36 },
            { 0xFD87B5F28300CA0E,  -157,  -28 },
            { 0xBCE5086492111AEB,  -130,  -20 },
            { 0x8CBCCC096F5088CC,  -103,  -12 },
            { 0xD1B71758E219652C,   -77,   -4 },
            { 0x9C40000000000000,   -50,    4 },
            { 0xE8D4A51000000000,   -24,   12 },
            { 0xAD78EBC5AC620000,     3,   20 },
            { 0x813F3978F8940984,    30,   28 },
            { 0xC097CE7BC90715B3,    56,   36 },
            { 0x8F7E32CE7BEA5C70,    83,   44 },
            { 0xD5D238A4ABE98068,   109,   52 },
            { 0x9F4F2726179A2245,   136,   60 },
            { 0xED63A231D4C4FB27,   162,   68 },
            { 0xB0DE65388CC8ADA8,   189,   76 },
            { 0x83C7088E1AAB65DB,   216,   84 },
            { 0xC45D1DF942711D9A,   242,   92 },
            { 0x924D692CA61BE758,   269,  100 },
            { 0xDA01EE641A708DEA,   295,  108 },
            { 0xA26DA3999AEF774A,   322,  116 },
            { 0xF209787BB47D6B85,   348,  124 },
            { 0xB454E4A179DD1877,   375,  132 },
            { 0x865B86925B9BC5C2,   402,  140 },
            { 0xC83553C5C8965D3D,   428,  148 },
            { 0x952AB45CFA97A0B3,   455,  156 },
            { 0xDE469FBD99A05FE3,   481,  164 },
            { 0xA59BC234DB398C25,   508,  172 },
            { 0xF6C69A72A3989F5C,   534,  180 },
            { 0xB7DCBF5354E9BECE,   561,  188 },
            { 0x88FCF317F22241E2,   588,  196 },
            { 0xCC20CE9BD35C78A5,   614,  204 },
            { 0x98165AF37B2153DF,   641,  212 },
            { 0xE2A0B5DC971F303A,   667,  220 },
            { 0xA8D9D1535CE3B396,   694,  228 },
            { 0xFB9B7CD9A4A7443C,   720,  236 },
            { 0xBB764C4CA7A44410,   747,  244 },
            { 0x8BAB8EEFB6409C1A,   774,  252 },
            { 0xD01FEF10A657842C,   800,  260 },
            { 0x9B10A4E5E9913129,   827,  268 },
            { 0xE7109BFBA19C0C9D,   853,  276 },
            { 0xAC2820D9623BF429,   880,  284 },
            { 0x80444B5E7AA7CF85,   907,  292 },
            { 0xBF21E44003ACDD2D,   933,  300 },
            { 0x8E679C2F5E44FF8F,   960,  308 },
            { 0xD433179D9C8CB841,   986,  316 },
            { 0x9E19DB92B4E31BA9,  1013,  324 },
        }
    };

    // This computation gives exactly the same results for k as
    //      k = ceil((kAlpha - e - 1) * 0.30102999566398114)
    // for |e| <= 1500, but doesn't require floating-point operations.
    // NB: log_10(2) ~= 78913 / 2^18
    JSON_ASSERT(e >= -1500);
    JSON_ASSERT(e <=  1500);
    const int f = kAlpha - e - 1;
    const int k = (f * 78913) / (1 << 18) + static_cast<int>(f > 0);

    const int index = (-kCachedPowersMinDecExp + k + (kCachedPowersDecStep - 1)) / kCachedPowersDecStep;
    JSON_ASSERT(index >= 0);
    JSON_ASSERT(static_cast<std::size_t>(index) < kCachedPowers.size());

    const cached_power cached = kCachedPowers[static_cast<std::size_t>(index)];
    JSON_ASSERT(kAlpha <= cached.e + e + 64);
    JSON_ASSERT(kGamma >= cached.e + e + 64);

    return cached;
}